

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,BaseReg *ref,char *name)

{
  byte bVar1;
  uint32_t uVar2;
  Error EVar3;
  VirtReg *pVVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t typeId;
  RegInfo regInfo;
  VirtReg *vReg;
  
  (out->super_Operand).super_Operand_._signature = 0;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  if ((ref->super_Operand).super_Operand_._baseId - 0x100 <
      (this->_vRegArray).super_ZoneVectorBase._size) {
    pVVar4 = virtRegByReg(this,ref);
    bVar1 = pVVar4->_typeId;
    uVar7 = (uint32_t)bVar1;
    typeId = (uint32_t)bVar1;
    uVar2 = Type::sizeOf(typeId);
    uVar5 = (ref->super_Operand).super_Operand_._signature >> 0x18;
    if (uVar2 != uVar5) {
      uVar6 = (uint)bVar1;
      if (bVar1 - 0x20 < 10) {
        switch(uVar5) {
        case 1:
          uVar7 = uVar6 & 1 | 0x22;
          typeId = uVar7;
          break;
        case 2:
          uVar7 = uVar6 & 1 | 0x24;
          typeId = uVar7;
          break;
        default:
switchD_0011138d_caseD_3:
          EVar3 = BaseEmitter::reportError((BaseEmitter *)this,3,(char *)0x0);
          return EVar3;
        case 4:
          uVar7 = uVar6 & 1 | 0x26;
          typeId = uVar7;
          break;
        case 8:
          uVar7 = uVar6 & 1 | 0x28;
          typeId = uVar7;
        }
      }
      else if (bVar1 - 0x31 < 2) {
        typeId = 0x32;
        uVar7 = 0x32;
      }
      else if (bVar1 - 0x2d < 4) {
        switch(uVar5) {
        case 1:
          typeId = 0x2d;
          uVar7 = 0x2d;
          break;
        case 2:
          typeId = 0x2e;
          uVar7 = 0x2e;
          break;
        default:
          goto switchD_0011138d_caseD_3;
        case 4:
          typeId = 0x2f;
          uVar7 = 0x2f;
          break;
        case 8:
          typeId = 0x30;
          uVar7 = 0x30;
        }
      }
      else {
        bVar1 = Type::_typeData[uVar6];
        if (uVar5 == 0x40) {
          uVar7 = bVar1 + 0x39;
          typeId = uVar7;
        }
        else if (uVar5 == 0x20) {
          uVar7 = bVar1 + 0x2f;
          typeId = uVar7;
        }
        else {
          if (uVar5 != 0x10) goto switchD_0011138d_caseD_3;
          uVar7 = bVar1 + 0x25;
          typeId = uVar7;
        }
      }
    }
  }
  else {
    uVar7 = (ref->super_Operand).super_Operand_._signature >> 3 & 0x1f;
    typeId = uVar7;
  }
  EVar3 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_BaseBuilder).super_BaseEmitter._environment._arch,uVar7,
                     &typeId,&regInfo);
  if (EVar3 == 0) {
    EVar3 = newVirtReg(this,&vReg,typeId,regInfo._signature,name);
    if (EVar3 == 0) {
      uVar7 = vReg->_id;
      (out->super_Operand).super_Operand_._signature = regInfo._signature;
      (out->super_Operand).super_Operand_._baseId = uVar7;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
    }
  }
  else {
    EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
  }
  return EVar3;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, const BaseReg& ref, const char* name) {
  out->reset();

  RegInfo regInfo;
  uint32_t typeId;

  if (isVirtRegValid(ref)) {
    VirtReg* vRef = virtRegByReg(ref);
    typeId = vRef->typeId();

    // NOTE: It's possible to cast one register type to another if it's the
    // same register group. However, VirtReg always contains the TypeId that
    // was used to create the register. This means that in some cases we may
    // end up having different size of `ref` and `vRef`. In such case we
    // adjust the TypeId to match the `ref` register type instead of the
    // original register type, which should be the expected behavior.
    uint32_t typeSize = Type::sizeOf(typeId);
    uint32_t refSize = ref.size();

    if (typeSize != refSize) {
      if (Type::isInt(typeId)) {
        // GP register - change TypeId to match `ref`, but keep sign of `vRef`.
        switch (refSize) {
          case  1: typeId = Type::kIdI8  | (typeId & 1); break;
          case  2: typeId = Type::kIdI16 | (typeId & 1); break;
          case  4: typeId = Type::kIdI32 | (typeId & 1); break;
          case  8: typeId = Type::kIdI64 | (typeId & 1); break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else if (Type::isMmx(typeId)) {
        // MMX register - always use 64-bit.
        typeId = Type::kIdMmx64;
      }
      else if (Type::isMask(typeId)) {
        // Mask register - change TypeId to match `ref` size.
        switch (refSize) {
          case  1: typeId = Type::kIdMask8; break;
          case  2: typeId = Type::kIdMask16; break;
          case  4: typeId = Type::kIdMask32; break;
          case  8: typeId = Type::kIdMask64; break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else {
        // VEC register - change TypeId to match `ref` size, keep vector metadata.
        uint32_t elementTypeId = Type::baseOf(typeId);

        switch (refSize) {
          case 16: typeId = Type::_kIdVec128Start + (elementTypeId - Type::kIdI8); break;
          case 32: typeId = Type::_kIdVec256Start + (elementTypeId - Type::kIdI8); break;
          case 64: typeId = Type::_kIdVec512Start + (elementTypeId - Type::kIdI8); break;
          default: typeId = Type::kIdVoid; break;
        }
      }

      if (typeId == Type::kIdVoid)
        return reportError(DebugUtils::errored(kErrorInvalidState));
    }
  }
  else {
    typeId = ref.type();
  }

  Error err = ArchUtils::typeIdToRegInfo(arch(), typeId, &typeId, &regInfo);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regInfo.signature(), name));

  out->_initReg(regInfo.signature(), vReg->id());
  return kErrorOk;
}